

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Builder * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::getResults
          (Builder *__return_storage_ptr__,RpcCallContext *this,Maybe<capnp::MessageSize> *sizeHint)

{
  uint uVar1;
  RpcServerResponse *pRVar2;
  RpcConnectionState *pRVar3;
  undefined8 *puVar4;
  int iVar5;
  ulong uVar6;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> response;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> local_b8;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> local_a8;
  Builder local_98;
  BuilderFor<capnp::rpc::Message> local_78;
  Builder local_48;
  
  pRVar2 = (this->response).ptr.ptr;
  if (pRVar2 == (RpcServerResponse *)0x0) {
    local_b8.disposer = (Disposer *)0x0;
    local_b8.ptr = (RpcServerResponse *)0x0;
    if ((this->redirectResults == false) &&
       (pRVar3 = (this->connectionState).ptr, (pRVar3->connection).tag == 1)) {
      puVar4 = *(undefined8 **)((long)&(pRVar3->connection).field_1 + 0x10);
      iVar5 = 0;
      if ((sizeHint->ptr).isSet == true) {
        uVar1 = (sizeHint->ptr).field_1.value.capCount;
        uVar6 = ((ulong)(uVar1 * 4) + (sizeHint->ptr).field_1.value.wordCount + 1) -
                (ulong)(uVar1 == 0);
        if (0xfffff < uVar6) {
          uVar6 = 0x100000;
        }
        iVar5 = (int)uVar6 + 8;
      }
      (**(code **)*puVar4)(&local_a8,puVar4,iVar5);
      (**(local_a8.ptr)->_vptr_OutgoingRpcMessage)(&local_98);
      AnyPointer::Builder::initAs<capnp::rpc::Message>(&local_78,&local_98);
      rpc::Message::Builder::initReturn(&local_48,&local_78);
      (this->returnMessage)._builder.dataSize = local_48._builder.dataSize;
      (this->returnMessage)._builder.pointerCount = local_48._builder.pointerCount;
      *(undefined2 *)&(this->returnMessage)._builder.field_0x26 = local_48._builder._38_2_;
      (this->returnMessage)._builder.data = local_48._builder.data;
      (this->returnMessage)._builder.pointers = local_48._builder.pointers;
      (this->returnMessage)._builder.segment = local_48._builder.segment;
      (this->returnMessage)._builder.capTable = local_48._builder.capTable;
      pRVar3 = (this->connectionState).ptr;
      rpc::Return::Builder::getResults((Builder *)&local_48,&this->returnMessage);
      kj::
      heap<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::OutgoingRpcMessage,decltype(nullptr)>,capnp::rpc::Payload::Builder>
                ((kj *)&local_98,pRVar3,&local_a8,(Builder *)&local_48);
      local_78._builder.segment = local_98.builder.segment;
      local_78._builder.capTable = local_98.builder.capTable;
      local_98.builder.capTable = (CapTableBuilder *)0x0;
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::
      operator=(&local_b8,
                (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                 *)&local_78);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::
      dispose((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *
              )&local_78);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,_std::nullptr_t>::
      dispose((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,_std::nullptr_t>
               *)&local_98);
      kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::dispose(&local_a8);
    }
    else {
      kj::
      refcounted<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,kj::Maybe<capnp::MessageSize>&>
                ((kj *)&local_78,sizeHint);
      local_48._builder.segment = local_78._builder.segment;
      local_48._builder.capTable = (CapTableBuilder *)((long)local_78._builder.capTable + 8);
      if ((LocallyRedirectedRpcResponse *)local_78._builder.capTable ==
          (LocallyRedirectedRpcResponse *)0x0) {
        local_48._builder.capTable = (CapTableBuilder *)0x0;
      }
      local_78._builder.capTable = (CapTableBuilder *)0x0;
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::
      operator=(&local_b8,
                (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                 *)&local_48);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::
      dispose((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *
              )&local_48);
      kj::
      Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
      ::dispose((Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
                 *)&local_78);
    }
    (**(local_b8.ptr)->_vptr_RpcServerResponse)(__return_storage_ptr__);
    local_48._builder.segment = (SegmentBuilder *)local_b8.disposer;
    local_48._builder.capTable = (CapTableBuilder *)local_b8.ptr;
    local_b8.ptr = (RpcServerResponse *)0x0;
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::
    operator=(&(this->response).ptr,
              (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *
              )&local_48);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::dispose
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                *)&local_48);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::dispose
              (&local_b8);
  }
  else {
    (**pRVar2->_vptr_RpcServerResponse)(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
      KJ_IF_SOME(r, response) {
        return r->getResultsBuilder();
      } else {
        kj::Own<RpcServerResponse> response;

        if (redirectResults || !connectionState->connection.is<Connected>()) {
          response = kj::refcounted<LocallyRedirectedRpcResponse>(sizeHint);
        } else {
          auto message = connectionState->connection.get<Connected>().connection
              ->newOutgoingMessage(
                  firstSegmentSize(sizeHint, messageSizeHint<rpc::Return>() +
                                  sizeInWords<rpc::Payload>()));
          returnMessage = message->getBody().initAs<rpc::Message>().initReturn();
          response = kj::heap<RpcServerResponseImpl>(
              *connectionState, kj::mv(message), returnMessage.getResults());
        }

        auto results = response->getResultsBuilder();
        this->response = kj::mv(response);
        return results;
      }